

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QSet<QGesture*>>
                 (QDebug *debug,char *which,QSet<QGesture_*> *c)

{
  bool bVar1;
  QDebug *o;
  QSet<QGesture_*> *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QGesture *unaff_retaddr;
  QDebug *in_stack_00000008;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  Stream *this;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QDebug in_stack_ffffffffffffffc8;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<((QDebug *)in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  QSet<QGesture_*>::begin(in_RDX);
  QSet<QGesture_*>::end(in_RDX);
  bVar1 = QSet<QGesture_*>::const_iterator::operator!=
                    ((const_iterator *)this,(const_iterator *)in_RDI);
  if (bVar1) {
    QDebug::QDebug(&local_40,in_RSI);
    QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x325817);
    ::operator<<(in_stack_00000008,unaff_retaddr);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    QDebug::~QDebug(&local_40);
    QSet<QGesture_*>::const_iterator::operator++((const_iterator *)this);
  }
  while (bVar1 = QSet<QGesture_*>::const_iterator::operator!=
                           ((const_iterator *)this,(const_iterator *)in_RDI), bVar1) {
    o = QDebug::operator<<((QDebug *)in_RDX,(char *)in_stack_ffffffffffffffc8.stream);
    QDebug::QDebug(&local_50,o);
    QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x325886);
    ::operator<<(in_stack_00000008,unaff_retaddr);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QSet<QGesture_*>::const_iterator::operator++((const_iterator *)this);
  }
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  QDebug::QDebug((QDebug *)this,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}